

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyInstance.cpp
# Opt level: O0

void Js::WebAssemblyInstance::ValidateTableAndMemory
               (WebAssemblyModule *wasmModule,ScriptContext *ctx,WebAssemblyEnvironment *env)

{
  bool bVar1;
  ArrayBufferBase *this;
  ScriptContext *scriptContext;
  ArrayBufferBase *buffer;
  WebAssemblyMemory *mem;
  WebAssemblyTable *table;
  WebAssemblyEnvironment *env_local;
  ScriptContext *ctx_local;
  WebAssemblyModule *wasmModule_local;
  
  mem = (WebAssemblyMemory *)WebAssemblyEnvironment::GetTable(env,0);
  bVar1 = WebAssemblyModule::HasTableImport(wasmModule);
  if (bVar1) {
    if ((WebAssemblyTable *)mem == (WebAssemblyTable *)0x0) {
      JavascriptError::ThrowWebAssemblyLinkError(ctx,-0x7ff5e49c,(PCWSTR)0x0);
    }
  }
  else {
    mem = (WebAssemblyMemory *)WebAssemblyModule::CreateTable(wasmModule);
    WebAssemblyEnvironment::SetTable(env,0,(WebAssemblyTable *)mem);
  }
  buffer = (ArrayBufferBase *)WebAssemblyEnvironment::GetMemory(env,0);
  bVar1 = WebAssemblyModule::HasMemoryImport(wasmModule);
  if (bVar1) {
    if ((WebAssemblyMemory *)buffer == (WebAssemblyMemory *)0x0) {
      JavascriptError::ThrowWebAssemblyLinkError(ctx,-0x7ff5e4a0,(PCWSTR)0x0);
    }
  }
  else {
    buffer = (ArrayBufferBase *)WebAssemblyModule::CreateMemory(wasmModule);
    if ((WebAssemblyMemory *)buffer == (WebAssemblyMemory *)0x0) {
      JavascriptError::ThrowWebAssemblyLinkError(ctx,-0x7ff5e490,(PCWSTR)0x0);
    }
    WebAssemblyEnvironment::SetMemory(env,0,(WebAssemblyMemory *)buffer);
  }
  this = WebAssemblyMemory::GetBuffer((WebAssemblyMemory *)buffer);
  bVar1 = ArrayBufferBase::IsDetached(this);
  if (bVar1) {
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)wasmModule);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  WebAssemblyEnvironment::CalculateOffsets(env,(WebAssemblyTable *)mem,(WebAssemblyMemory *)buffer);
  return;
}

Assistant:

void WebAssemblyInstance::ValidateTableAndMemory(WebAssemblyModule * wasmModule, ScriptContext* ctx, WebAssemblyEnvironment* env)
{
    WebAssemblyTable* table = env->GetTable(0);
    if (wasmModule->HasTableImport())
    {
        if (table == nullptr)
        {
            JavascriptError::ThrowWebAssemblyLinkError(ctx, WASMERR_NeedTableObject);
        }
    }
    else
    {
        table = wasmModule->CreateTable();
        env->SetTable(0, table);
    }

    WebAssemblyMemory* mem = env->GetMemory(0);
    if (wasmModule->HasMemoryImport())
    {
        if (mem == nullptr)
        {
            JavascriptError::ThrowWebAssemblyLinkError(ctx, WASMERR_NeedMemoryObject);
        }
    }
    else
    {
        mem = wasmModule->CreateMemory();
        if (mem == nullptr)
        {
            JavascriptError::ThrowWebAssemblyLinkError(ctx, WASMERR_MemoryCreateFailed);
        }
        env->SetMemory(0, mem);
    }
    ArrayBufferBase * buffer = mem->GetBuffer();
    if (buffer->IsDetached())
    {
        JavascriptError::ThrowTypeError(wasmModule->GetScriptContext(), JSERR_DetachedTypedArray);
    }

    env->CalculateOffsets(table, mem);
}